

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::tree_node<char,_false>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<char,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  ref<immutable::rrb_details::rrb_size_table<false>_> *__dest;
  int *piVar1;
  rrb_size_table<false> *prVar2;
  uint32_t *puVar3;
  ref<immutable::rrb_details::internal_node<char,_false>_> rVar4;
  undefined4 *__ptr;
  internal_node<char,_false> *piVar5;
  uint32_t uVar6;
  ulong uVar7;
  char *__function;
  uint uVar8;
  tree_node<char,_false> *ptVar9;
  undefined4 in_register_00000084;
  long lVar10;
  internal_node<char,_false> *p_node;
  ulong uVar11;
  uint uVar12;
  ref<immutable::rrb_details::internal_node<char,_false>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_false>_> left_hand_node;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_90;
  size_t local_88;
  internal_node<char,_false> *local_80;
  undefined8 local_78;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_70;
  uint32_t local_64;
  rrb_size_table<false> *local_60;
  tree_node<char,_false> *local_58;
  uint32_t *local_50;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_48;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_40;
  ref<immutable::rrb_details::rrb_size_table<false>_> *local_38;
  
  local_78 = CONCAT44(in_register_00000084,shift);
  uVar12 = left >> ((byte)shift & 0x1f);
  p_node = (internal_node<char,_false> *)root->ptr;
  if (shift == 0) {
    if (p_node != (internal_node<char,_false> *)0x0) {
      p_node->_ref_count = p_node->_ref_count + 1;
      uVar6 = p_node->len;
      uVar11 = (ulong)(uVar6 - uVar12);
      __ptr = (undefined4 *)malloc(uVar11 + 0x18);
      __ptr[1] = uVar6 - uVar12;
      *__ptr = 0;
      *(undefined4 **)(__ptr + 4) = __ptr + 6;
      __ptr[3] = 0;
      if (uVar6 - uVar12 != 0) {
        uVar7 = 0;
        do {
          *(undefined1 *)(*(long *)(__ptr + 4) + uVar7) = 0;
          uVar7 = uVar7 + 1;
        } while (uVar11 != uVar7);
      }
      __ptr[2] = 1;
      if (uVar6 != uVar12) {
        uVar7 = 0;
        do {
          *(undefined1 *)(*(long *)(__ptr + 4) + uVar7) =
               *(undefined1 *)
                ((long)&((p_node->size_table).ptr)->size + (ulong)(uVar12 + (int)uVar7));
          uVar7 = uVar7 + 1;
        } while (uVar11 != uVar7);
      }
      *total_shift = 0;
      *(undefined4 **)this = __ptr;
      if (__ptr[2] == 0) {
        free(__ptr);
      }
      uVar6 = p_node->_ref_count;
      p_node->_ref_count = uVar6 - 1;
      if (uVar6 != 1) {
        return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
      }
      free(p_node);
      return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
    ;
    goto LAB_00156485;
  }
  if (p_node != (internal_node<char,_false> *)0x0) {
    p_node->_ref_count = p_node->_ref_count + 1;
    prVar2 = (p_node->size_table).ptr;
    if (prVar2 == (rrb_size_table<false> *)0x0) {
      uVar6 = left - (uVar12 << ((byte)shift & 0x1f));
    }
    else {
      puVar3 = prVar2->size;
      uVar11 = (ulong)(uVar12 - 1);
      do {
        uVar7 = uVar11;
        uVar12 = (int)uVar7 + 1;
        uVar11 = (ulong)uVar12;
      } while (puVar3[uVar12] <= left);
      uVar6 = left;
      if (uVar12 != 0) {
        uVar6 = left - puVar3[uVar7];
      }
    }
    uVar8 = p_node->len - 1;
    local_40.ptr = (tree_node<char,_false> *)p_node->child[uVar12].ptr;
    if ((internal_node<char,_false> *)local_40.ptr != (internal_node<char,_false> *)0x0) {
      ((internal_node<char,_false> *)local_40.ptr)->_ref_count =
           ((internal_node<char,_false> *)local_40.ptr)->_ref_count + 1;
    }
    local_58 = (tree_node<char,_false> *)this;
    local_50 = total_shift;
    rrb_drop_left_rec<char,false,6>
              ((rrb_details *)&local_70,total_shift,&local_40,uVar6,shift - 6,
               uVar12 != uVar8 || has_right);
    if (uVar12 != uVar8) {
      local_64 = p_node->len;
      uVar8 = local_64 - uVar12;
      uVar11 = (ulong)uVar8;
      local_88 = uVar11 * 8;
      local_80 = p_node;
      piVar5 = (internal_node<char,_false> *)malloc(uVar11 * 8 + 0x20);
      piVar5->len = uVar8;
      piVar5->type = INTERNAL_NODE;
      local_38 = &piVar5->size_table;
      (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar5->guid = 0;
      piVar5->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar5 + 1);
      memset(piVar5 + 1,0,local_88);
      piVar5->_ref_count = 1;
      local_88 = (ulong)uVar12;
      for (lVar10 = 0; p_node = local_80, uVar12 = uVar12 + 1, (ulong)(uVar8 - 1) << 3 != lVar10;
          lVar10 = lVar10 + 8) {
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                   ((long)&piVar5->child[1].ptr + lVar10),local_80->child + uVar12);
      }
      prVar2 = (local_80->size_table).ptr;
      if (prVar2 != (rrb_size_table<false> *)0x0) {
        prVar2->_ref_count = prVar2->_ref_count + 1;
      }
      local_90.ptr = (internal_node<char,_false> *)malloc(uVar11 * 4 + 0x10);
      ptVar9 = local_58;
      __dest = &(local_90.ptr)->size_table;
      *(ref<immutable::rrb_details::rrb_size_table<false>_> **)local_90.ptr = __dest;
      (local_90.ptr)->guid = 0;
      (local_90.ptr)->_ref_count = 1;
      uVar6 = (uint32_t)local_78;
      local_60 = prVar2;
      if (prVar2 == (rrb_size_table<false> *)0x0) {
        if (local_64 != (uint32_t)local_88) {
          uVar7 = 0;
          do {
            *(uint32_t *)((long)&__dest->ptr + uVar7 * 4) =
                 (uint32_t)local_88 + 1 + (int)uVar7 << ((byte)local_78 & 0x1f);
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
      }
      else {
        memcpy(__dest,prVar2->size + local_88,uVar11 * 4);
      }
      if (local_64 != (uint32_t)local_88) {
        if (local_90.ptr == (internal_node<char,_false> *)0x0) {
LAB_00156470:
          __function = 
          "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
          ;
          goto LAB_00156485;
        }
        lVar10 = *(long *)local_90.ptr;
        uVar7 = 0;
        do {
          piVar1 = (int *)(lVar10 + uVar7 * 4);
          *piVar1 = *piVar1 - left;
          uVar7 = uVar7 + 1;
        } while (uVar11 != uVar7);
      }
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (local_38,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_90);
      ref<immutable::rrb_details::internal_node<char,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar5->child,&local_70);
      *local_50 = uVar6;
      piVar5->_ref_count = piVar5->_ref_count + 1;
      *(internal_node<char,_false> **)ptVar9 = piVar5;
      if ((local_90.ptr != (internal_node<char,_false> *)0x0) &&
         (uVar6 = (local_90.ptr)->_ref_count, (local_90.ptr)->_ref_count = uVar6 - 1, uVar6 == 1)) {
        free(local_90.ptr);
      }
      if ((local_60 != (rrb_size_table<false> *)0x0) &&
         (uVar6 = local_60->_ref_count, local_60->_ref_count = uVar6 - 1, uVar6 == 1)) {
        free(local_60);
      }
      release<char>(piVar5);
      goto LAB_00156414;
    }
    if (!has_right) {
      *(tree_node<char,_false> **)local_58 = local_70.ptr;
      ptVar9 = local_58;
      if ((internal_node<char,_false> *)local_70.ptr != (internal_node<char,_false> *)0x0) {
        (local_70.ptr)->_ref_count = (local_70.ptr)->_ref_count + 1;
      }
      goto LAB_00156414;
    }
    piVar5 = (internal_node<char,_false> *)malloc(0x28);
    piVar5->type = INTERNAL_NODE;
    piVar5->len = 1;
    (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
    piVar5->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar5 + 1);
    piVar5[1].type = LEAF_NODE;
    piVar5[1].len = 0;
    piVar5->_ref_count = 1;
    piVar5->guid = 0;
    local_90.ptr = (internal_node<char,_false> *)local_70.ptr;
    if ((internal_node<char,_false> *)local_70.ptr != (internal_node<char,_false> *)0x0) {
      (local_70.ptr)->_ref_count = (local_70.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=(piVar5->child,&local_90);
    puVar3 = local_50;
    rVar4.ptr = local_90.ptr;
    if (shift - 6 != 0) {
      if (local_90.ptr == (internal_node<char,_false> *)0x0) goto LAB_00156442;
      if (((local_90.ptr)->size_table).ptr != (rrb_size_table<false> *)0x0) {
        local_48.ptr = (rrb_size_table<false> *)malloc(0x14);
        (local_48.ptr)->size = (uint32_t *)(local_48.ptr + 1);
        (local_48.ptr)->guid = 0;
        (local_48.ptr)->_ref_count = 1;
        prVar2 = ((rVar4.ptr)->size_table).ptr;
        if (prVar2 == (rrb_size_table<false> *)0x0) goto LAB_00156470;
        *(uint32_t *)&local_48.ptr[1].size = prVar2->size[(rVar4.ptr)->len - 1];
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&local_48);
        if ((local_48.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar6 = (local_48.ptr)->_ref_count, (local_48.ptr)->_ref_count = uVar6 - 1, uVar6 == 1))
        {
          free(local_48.ptr);
        }
      }
    }
    ptVar9 = local_58;
    *puVar3 = (uint32_t)local_78;
    *(internal_node<char,_false> **)local_58 = piVar5;
    piVar5->_ref_count = piVar5->_ref_count + 1;
    release<char>(local_90.ptr);
    release<char>(piVar5);
LAB_00156414:
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_70);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_40);
    release<char>(p_node);
    return (ref<immutable::rrb_details::tree_node<char,_false>_>)ptVar9;
  }
LAB_00156442:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
  ;
LAB_00156485:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }